

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

bool rcg::saveStreamableParameters
               (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception)

{
  CFeatureBag bag;
  ofstream out;
  
  GenApi_3_4::CFeatureBag::CFeatureBag(&bag);
  GenApi_3_4::CFeatureBag::StoreToBag
            ((INodeMap *)&bag,
             (int)(((nodemap->
                    super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,
             (gcstring_vector *)0xffffffffffffffff);
  std::ofstream::ofstream(&out);
  std::ios::exceptions((int)&out + (int)*(undefined8 *)(_out + -0x18));
  std::ofstream::open((char *)&out,(_Ios_Openmode)name);
  GenApi_3_4::operator<<((ostream *)&out,&bag);
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  GenApi_3_4::CFeatureBag::~CFeatureBag(&bag);
  return true;
}

Assistant:

bool saveStreamableParameters(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  bool exception)
{
  bool ret=false;

  try
  {
    GenApi::CFeatureBag bag;

    bag.StoreToBag(nodemap->_Ptr);

    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);

    out.open(name);
    out << bag;
    out.close();

    ret=true;
  }
  catch (const std::exception &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}